

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::PsbtBip32Data::PsbtBip32Data(PsbtBip32Data *this,PsbtBip32Data *param_1)

{
  (this->super_JsonClassBase<cfd::js::api::json::PsbtBip32Data>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtBip32Data_00b3f670;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  std::__cxx11::string::string((string *)&this->pubkey_,(string *)&param_1->pubkey_);
  std::__cxx11::string::string
            ((string *)&this->master_fingerprint_,(string *)&param_1->master_fingerprint_);
  std::__cxx11::string::string((string *)&this->path_,(string *)&param_1->path_);
  std::__cxx11::string::string((string *)&this->descriptor_,(string *)&param_1->descriptor_);
  return;
}

Assistant:

PsbtBip32Data() {
    CollectFieldName();
  }